

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyHttpImpl::ignoreSslErrors(QNetworkReplyHttpImpl *this)

{
  char cVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QNetworkReply local_30;
  
  local_30._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  lVar3 = *(long *)(lVar2 + 0x238);
  cVar1 = *(char *)(lVar3 + 0xf8);
  if (cVar1 == '\x01') {
    QNetworkReply::url(&local_30);
    bVar4 = QHstsCache::isKnownHost((QHstsCache *)(lVar3 + 0xb8),(QUrl *)&local_30);
  }
  else {
    bVar4 = false;
  }
  if (cVar1 != '\0') {
    QUrl::~QUrl((QUrl *)&local_30);
  }
  if (bVar4 == false) {
    *(undefined1 *)(lVar2 + 0x360) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImpl::ignoreSslErrors()
{
    Q_D(QNetworkReplyHttpImpl);
    Q_ASSERT(d->managerPrivate);

    if (d->managerPrivate->stsEnabled && d->managerPrivate->stsCache.isKnownHost(url())) {
        // We cannot ignore any Security Transport-related errors for this host.
        return;
    }

    d->pendingIgnoreAllSslErrors = true;
}